

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThread.cpp
# Opt level: O1

bool __thiscall xmrig::CudaThread::isEqual(CudaThread *this,CudaThread *other)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2[0] = -((char)other->m_blocks == (char)this->m_blocks);
  auVar2[1] = -(*(char *)((long)&other->m_blocks + 1) == *(char *)((long)&this->m_blocks + 1));
  auVar2[2] = -(*(char *)((long)&other->m_blocks + 2) == *(char *)((long)&this->m_blocks + 2));
  auVar2[3] = -(*(char *)((long)&other->m_blocks + 3) == *(char *)((long)&this->m_blocks + 3));
  auVar2[4] = -((char)other->m_threads == (char)this->m_threads);
  auVar2[5] = -(*(char *)((long)&other->m_threads + 1) == *(char *)((long)&this->m_threads + 1));
  auVar2[6] = -(*(char *)((long)&other->m_threads + 2) == *(char *)((long)&this->m_threads + 2));
  auVar2[7] = -(*(char *)((long)&other->m_threads + 3) == *(char *)((long)&this->m_threads + 3));
  auVar2[8] = -((char)other->m_affinity == (char)this->m_affinity);
  auVar2[9] = -(*(char *)((long)&other->m_affinity + 1) == *(char *)((long)&this->m_affinity + 1));
  auVar2[10] = -(*(char *)((long)&other->m_affinity + 2) == *(char *)((long)&this->m_affinity + 2));
  auVar2[0xb] = -(*(char *)((long)&other->m_affinity + 3) == *(char *)((long)&this->m_affinity + 3))
  ;
  auVar2[0xc] = -(*(char *)((long)&other->m_affinity + 4) == *(char *)((long)&this->m_affinity + 4))
  ;
  auVar2[0xd] = -(*(char *)((long)&other->m_affinity + 5) == *(char *)((long)&this->m_affinity + 5))
  ;
  auVar2[0xe] = -(*(char *)((long)&other->m_affinity + 6) == *(char *)((long)&this->m_affinity + 6))
  ;
  auVar2[0xf] = -(*(char *)((long)&other->m_affinity + 7) == *(char *)((long)&this->m_affinity + 7))
  ;
  auVar1[0] = -(*(char *)((long)&other->m_affinity + 4) == *(char *)((long)&this->m_affinity + 4));
  auVar1[1] = -(*(char *)((long)&other->m_affinity + 5) == *(char *)((long)&this->m_affinity + 5));
  auVar1[2] = -(*(char *)((long)&other->m_affinity + 6) == *(char *)((long)&this->m_affinity + 6));
  auVar1[3] = -(*(char *)((long)&other->m_affinity + 7) == *(char *)((long)&this->m_affinity + 7));
  auVar1[4] = -((char)other->m_index == (char)this->m_index);
  auVar1[5] = -(*(char *)((long)&other->m_index + 1) == *(char *)((long)&this->m_index + 1));
  auVar1[6] = -(*(char *)((long)&other->m_index + 2) == *(char *)((long)&this->m_index + 2));
  auVar1[7] = -(*(char *)((long)&other->m_index + 3) == *(char *)((long)&this->m_index + 3));
  auVar1[8] = -((char)other->m_bfactor == (char)this->m_bfactor);
  auVar1[9] = -(*(char *)((long)&other->m_bfactor + 1) == *(char *)((long)&this->m_bfactor + 1));
  auVar1[10] = -(*(char *)((long)&other->m_bfactor + 2) == *(char *)((long)&this->m_bfactor + 2));
  auVar1[0xb] = -(*(char *)((long)&other->m_bfactor + 3) == *(char *)((long)&this->m_bfactor + 3));
  auVar1[0xc] = -((char)other->m_bsleep == (char)this->m_bsleep);
  auVar1[0xd] = -(*(char *)((long)&other->m_bsleep + 1) == *(char *)((long)&this->m_bsleep + 1));
  auVar1[0xe] = -(*(char *)((long)&other->m_bsleep + 2) == *(char *)((long)&this->m_bsleep + 2));
  auVar1[0xf] = -(*(char *)((long)&other->m_bsleep + 3) == *(char *)((long)&this->m_bsleep + 3));
  auVar1 = auVar1 & auVar2;
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) == 0xffff;
}

Assistant:

bool xmrig::CudaThread::isEqual(const CudaThread &other) const
{
    return m_blocks      == other.m_blocks &&
           m_threads     == other.m_threads &&
           m_affinity    == other.m_affinity &&
           m_index       == other.m_index &&
           m_bfactor     == other.m_bfactor &&
           m_bsleep      == other.m_bsleep;
}